

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefineVarCommand.cpp
# Opt level: O2

double __thiscall DefineVarCommand::execute(DefineVarCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  Variable *pVVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
  *p_Var4;
  MathInterpreter *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *data;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  local_50;
  
  bVar2 = std::operator==((this->type_data).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"var");
  if (bVar2) {
    bVar2 = std::operator==((this->type_data).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2,"->");
    if ((bVar2) ||
       (bVar2 = std::operator==((this->type_data).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2,"<-"), bVar2)) {
      pVVar3 = (Variable *)operator_new(0x70);
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4));
      Variable::Variable(pVVar3,&local_f0,&local_d0,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      p_Var4 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getInVarMap_abi_cxx11_(d);
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      local_50.second = pVVar3;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var4,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      p_Var4 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getSimVarMap_abi_cxx11_(d);
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4));
      local_50.second = pVVar3;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var4,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar2 = std::operator==((this->type_data).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2,"=");
    if ((bVar2) &&
       (pbVar1 = (this->type_data).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->type_data).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x80)) {
      pVVar3 = (Variable *)operator_new(0x70);
      std::__cxx11::string::string((string *)&local_90,(string *)(pbVar1 + 1));
      Variable::Variable(pVVar3,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      p_Var4 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getInVarMap_abi_cxx11_(d);
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((this->type_data).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      local_50.second = pVVar3;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var4,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (MathInterpreter *)operator_new(0x20);
      data = DataBase::getInVarMap_abi_cxx11_(d);
      MathInterpreter::MathInterpreter(this_00,data);
      pbVar1 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::operator+(&local_50.first,pbVar1 + 1,pbVar1 + 2);
      std::operator+(&local_70,&local_50.first,
                     (this->type_data).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3);
      MathInterpreter::insertVariables(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      MathInterpreter::~MathInterpreter(this_00);
      operator_delete(this_00,0x20);
    }
    return 0.0;
  }
  printf("failed definning var : wrong input");
  return 0.0;
}

Assistant:

double DefineVarCommand::execute() {
  if (!(this->type_data[0] == "var")) {
    printf("failed definning var : wrong input");
  } else {
    Variable *v;
    if ((this->type_data[2] == "->") || (this->type_data[2] == "<-")) {
      v = new Variable(type_data[1], type_data[2], type_data[4]);
      d->getInVarMap()->insert({this->type_data[1], v});
      d->getSimVarMap()->insert({this->type_data[4], v});
    }
    if ((this->type_data[2] == "=") && (this->type_data.size() == 4)) {
      v = new Variable(this->type_data[1]);
      d->getInVarMap()->insert({this->type_data[1], v});
      MathInterpreter *mi = new MathInterpreter(d->getInVarMap());
      mi->insertVariables(type_data[1] + type_data[2] + type_data[3]);
      delete mi;
    }
  }
  return 0;
}